

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O3

shared_ptr<MyCompiler::RelOp> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::RelOp>(RecursiveDescentParser *this)

{
  uint uVar1;
  char *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::RelOp> sVar4;
  string local_40;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::RelOp,std::allocator<MyCompiler::RelOp>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(RelOp **)this,
             (allocator<MyCompiler::RelOp> *)&local_40);
  uVar1 = in_RSI->sym - EQL;
  if (uVar1 < 6) {
    if (uVar1 < 5) {
      pcVar2 = &DAT_0010e06c + *(int *)(&DAT_0010e06c + (ulong)uVar1 * 4);
    }
    else {
      pcVar2 = ">=";
    }
    std::__cxx11::string::_M_replace
              ((ulong)(this->stream + 0x28),0,*(char **)(this->stream + 0x30),(ulong)pcVar2);
    nextSym(in_RSI);
    _Var3._M_pi = extraout_RDX_01;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"relational operator expected","");
    except(in_RSI,EQL,&local_40);
    _Var3._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  sVar4.super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::RelOp>)
         sVar4.super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::RelOp> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<RelOp>();

    if (sym == SymbolType::EQL || sym == SymbolType::NEQ || sym == SymbolType::LSS
        || sym == SymbolType::LEQ || sym == SymbolType::GTR || sym == SymbolType::GEQ)
    {
        switch (sym)
        {
            case SymbolType::EQL:
                pResult->value = "=";
                break;
            case SymbolType::NEQ:
                pResult->value = "#";
                break;
            case SymbolType::LSS:
                pResult->value = "<";
                break;
            case SymbolType::LEQ:
                pResult->value = "<=";
                break;
            case SymbolType::GTR:
                pResult->value = ">";
                break;
            default: // case SymbolType::GEQ:
                pResult->value = ">=";
        }
        accept(sym);
    }
    else
        except(SymbolType::EQL, "relational operator expected");

    return pResult;
}